

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lodtalk.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  VMContext *pVVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  allocator local_9a;
  allocator local_99;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  string scriptFilename;
  string local_50 [32];
  
  context = (VMContext *)Lodtalk::createVMContext();
  scriptFilename._M_dataplus._M_p = (pointer)&scriptFilename.field_2;
  scriptFilename._M_string_length = 0;
  scriptFilename.field_2._M_local_buf[0] = '\0';
  lVar5 = 1;
  do {
    if (argc <= lVar5) {
      if (scriptFilename._M_string_length == 0) {
        printHelp();
        iVar4 = -1;
      }
      else {
        loadKernel();
        bVar3 = std::operator==(&scriptFilename,"-");
        psVar2 = _stdin;
        pVVar1 = context;
        if (bVar3) {
          std::__cxx11::string::string((string *)local_98._M_pod_data,"stdin",&local_99);
          std::__cxx11::string::string(local_50,".",&local_9a);
          Lodtalk::VMContext::executeScriptFromFile
                    ((_IO_FILE *)pVVar1,psVar2,(string *)local_98._M_pod_data);
          std::__cxx11::string::~string(local_50);
          std::__cxx11::string::~string((string *)local_98._M_pod_data);
        }
        else {
          Lodtalk::VMContext::executeScriptFromFileNamed((string *)context);
        }
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_80 = std::
                   _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/apps/Lodtalk.cpp:62:30)>
                   ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/apps/Lodtalk.cpp:62:30)>
                   ::_M_manager;
        Lodtalk::VMContext::withInterpreter((function *)context);
        std::_Function_base::~_Function_base((_Function_base *)&local_98);
LAB_001023e8:
        iVar4 = 0;
      }
      std::__cxx11::string::~string((string *)&scriptFilename);
      return iVar4;
    }
    __s1 = argv[lVar5];
    iVar4 = strcmp(__s1,"-help");
    if ((iVar4 == 0) || (((*__s1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0')))) {
      printHelp();
      goto LAB_001023e8;
    }
    std::__cxx11::string::assign((char *)&scriptFilename);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char *argv[])
{
    context = createVMContext();

    std::string scriptFilename;

    for(int i = 1; i < argc; ++i)
    {
        if(!strcmp(argv[i], "-help") ||
           !strcmp(argv[i], "-h"))
        {
            printHelp();
            return 0;
        }
        else
        {
            scriptFilename = argv[i];
        }
    }

    if(scriptFilename.empty())
    {
        printHelp();
        return -1;
    }

    // Execute the kernel script
    loadKernel();

    // Execute the source script.
    if(scriptFilename == "-")
    {
        // Execute script from the standard input.
        context->executeScriptFromFile(stdin, "stdin");
    }
    else
    {
        // Execute the script from the file.
        context->executeScriptFromFileNamed(scriptFilename);
    }

    // Call the main function.
    context->withInterpreter([&](InterpreterProxy *interpreter) {
        interpreter->pushOop(context->getGlobalContext());
        interpreter->sendMessageWithSelector(context->makeSelector("main"), 0);
        interpreter->popOop();
    });
    return 0;
}